

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Functional::TextureUnitCase::iterate(TextureUnitCase *this)

{
  int iVar1;
  uint uVar2;
  RenderContext *context;
  TestLog *log;
  Texture2D *pTVar3;
  Texture3D *pTVar4;
  Texture2DArray *pTVar5;
  bool bVar6;
  int iVar7;
  ChannelOrder CVar8;
  ChannelType CVar9;
  undefined4 extraout_var;
  char *description;
  ChannelOrder height;
  int i;
  long lVar11;
  ChannelOrder width;
  Surface refFrame;
  Surface gles3Frame;
  ReferenceContextBuffers buffers;
  Random rnd;
  MultisamplePixelBufferAccess local_62b8;
  MultisamplePixelBufferAccess local_6290;
  MultisamplePixelBufferAccess local_6268;
  ReferenceContextLimits local_6240;
  vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> texSizes;
  ChannelOrder *pCVar10;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar7 = (*context->_vptr_RenderContext[4])(context);
  pCVar10 = (ChannelOrder *)CONCAT44(extraout_var,iVar7);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  deRandom_init(&rnd.m_rnd,this->m_randSeed);
  CVar8 = *pCVar10;
  width = 0x80;
  if ((int)CVar8 < 0x80) {
    width = CVar8;
  }
  height = 0x80;
  if ((int)pCVar10[1] < 0x80) {
    height = pCVar10[1];
  }
  CVar8 = de::Random::getInt((Random *)&rnd.m_rnd,0,CVar8 - width);
  CVar9 = de::Random::getInt((Random *)&rnd.m_rnd,0,pCVar10[1] - height);
  tcu::Surface::Surface(&gles3Frame,width,height);
  tcu::Surface::Surface(&refFrame,width,height);
  texSizes.super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texSizes.super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  texSizes.super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::reserve
            (&texSizes,(long)this->m_numUnits);
  for (lVar11 = 0; lVar11 < this->m_numUnits; lVar11 = lVar11 + 1) {
    iVar7 = (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11];
    iVar1 = (this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar7];
    uVar2 = (this->m_textureTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar7];
    if (uVar2 == 0x8c1a) {
      pTVar5 = (this->m_textures2dArray).
               super__Vector_base<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar1];
      buffers.m_colorbuffer.m_format.order = pTVar5->m_width;
      buffers.m_colorbuffer.m_format.type = pTVar5->m_height;
      buffers.m_colorbuffer.m_size.m_data[0] = 0;
      std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
      emplace_back<tcu::Vector<int,3>>
                ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&texSizes,
                 (Vector<int,_3> *)&buffers);
    }
    else if (uVar2 == 0x806f) {
      pTVar4 = (this->m_textures3d).
               super__Vector_base<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>._M_impl.
               super__Vector_impl_data._M_start[iVar1];
      buffers.m_colorbuffer.m_size.m_data[0] = pTVar4->m_depth;
      buffers.m_colorbuffer.m_format.order = pTVar4->m_width;
      buffers.m_colorbuffer.m_format.type = pTVar4->m_height;
      std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
      emplace_back<tcu::Vector<int,3>>
                ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&texSizes,
                 (Vector<int,_3> *)&buffers);
    }
    else if (uVar2 == 0x8513) {
      buffers.m_colorbuffer.m_format.type =
           (this->m_texturesCube).
           super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>._M_impl.
           super__Vector_impl_data._M_start[iVar1]->m_size;
      buffers.m_colorbuffer.m_format.order = buffers.m_colorbuffer.m_format.type;
      buffers.m_colorbuffer.m_size.m_data[0] = 0;
      std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
      emplace_back<tcu::Vector<int,3>>
                ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&texSizes,
                 (Vector<int,_3> *)&buffers);
    }
    else if (uVar2 == 0xde1) {
      pTVar3 = (this->m_textures2d).
               super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>._M_impl.
               super__Vector_impl_data._M_start[iVar1];
      buffers.m_colorbuffer.m_format.order = pTVar3->m_width;
      buffers.m_colorbuffer.m_format.type = pTVar3->m_height;
      buffers.m_colorbuffer.m_size.m_data[0] = 0;
      std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
      emplace_back<tcu::Vector<int,3>>
                ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&texSizes,
                 (Vector<int,_3> *)&buffers);
    }
  }
  buffers.m_colorbuffer.m_format.type = height;
  buffers.m_colorbuffer.m_format.order = width;
  MultiTexShader::makeSafeLods(this->m_shader,&texSizes,(IVec2 *)&buffers);
  std::_Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::~_Vector_base
            (&texSizes.
              super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>);
  buffers.m_colorbuffer.m_format.type = CVar9;
  buffers.m_colorbuffer.m_format.order = CVar8;
  buffers.m_colorbuffer.m_size.m_data[0] = width;
  buffers.m_colorbuffer.m_size.m_data[1] = height;
  sglr::GLContext::GLContext((GLContext *)&texSizes,context,log,3,(IVec4 *)&buffers);
  render(this,(Context *)&texSizes);
  sglr::Context::readPixels((Context *)&texSizes,&gles3Frame,0,0,width,height);
  sglr::GLContext::~GLContext((GLContext *)&texSizes);
  texSizes.super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x800000008;
  texSizes.super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)CONCAT44((uint)(pCVar10[5] != R) << 3,8);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&buffers,(PixelFormat *)&texSizes,0,0,width,height,1);
  sglr::ReferenceContextLimits::ReferenceContextLimits(&local_6240,context);
  sglr::ReferenceContextBuffers::getColorbuffer(&local_6268,&buffers);
  sglr::ReferenceContextBuffers::getDepthbuffer(&local_6290,&buffers);
  sglr::ReferenceContextBuffers::getStencilbuffer(&local_62b8,&buffers);
  sglr::ReferenceContext::ReferenceContext
            ((ReferenceContext *)&texSizes,&local_6240,&local_6268,&local_6290,&local_62b8);
  sglr::ReferenceContextLimits::~ReferenceContextLimits(&local_6240);
  render(this,(Context *)&texSizes);
  sglr::Context::readPixels((Context *)&texSizes,&refFrame,0,0,width,height);
  sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)&texSizes);
  sglr::ReferenceContextBuffers::~ReferenceContextBuffers(&buffers);
  bVar6 = tcu::fuzzyCompare(log,"ComparisonResult","Image comparison result",&refFrame,&gles3Frame,
                            0.001,COMPARE_LOG_RESULT);
  description = "Image comparison failed";
  if (bVar6) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar6,description
            );
  tcu::Surface::~Surface(&refFrame);
  tcu::Surface::~Surface(&gles3Frame);
  return STOP;
}

Assistant:

TextureUnitCase::IterateResult TextureUnitCase::iterate (void)
{
	glu::RenderContext&			renderCtx			= m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget		= renderCtx.getRenderTarget();
	tcu::TestLog&				log					= m_testCtx.getLog();
	de::Random					rnd					(m_randSeed);

	int							viewportWidth		= deMin32(VIEWPORT_WIDTH, renderTarget.getWidth());
	int							viewportHeight		= deMin32(VIEWPORT_HEIGHT, renderTarget.getHeight());
	int							viewportX			= rnd.getInt(0, renderTarget.getWidth() - viewportWidth);
	int							viewportY			= rnd.getInt(0, renderTarget.getHeight() - viewportHeight);

	tcu::Surface				gles3Frame			(viewportWidth, viewportHeight);
	tcu::Surface				refFrame			(viewportWidth, viewportHeight);

	{
		// First we do some tricks to make the LODs safer wrt. precision issues. See MultiTexShader::makeSafeLods().

		vector<IVec3> texSizes;
		texSizes.reserve(m_numUnits);

		for (int i = 0; i < m_numUnits; i++)
		{
			int		texNdx			= m_unitTextures[i];
			int		texNdxInType	= m_ndxTexType[texNdx];
			GLenum	type			= m_textureTypes[texNdx];

			switch (type)
			{
				case GL_TEXTURE_2D:			texSizes.push_back(IVec3(m_textures2d[texNdxInType]->getWidth(),		m_textures2d[texNdxInType]->getHeight(),		0));										break;
				case GL_TEXTURE_CUBE_MAP:	texSizes.push_back(IVec3(m_texturesCube[texNdxInType]->getSize(),		m_texturesCube[texNdxInType]->getSize(),		0));										break;
				case GL_TEXTURE_2D_ARRAY:	texSizes.push_back(IVec3(m_textures2dArray[texNdxInType]->getWidth(),	m_textures2dArray[texNdxInType]->getHeight(),	0));										break;
				case GL_TEXTURE_3D:			texSizes.push_back(IVec3(m_textures3d[texNdxInType]->getWidth(),		m_textures3d[texNdxInType]->getHeight(),		m_textures3d[texNdxInType]->getDepth()));	break;
				default:
					DE_ASSERT(DE_FALSE);
			}
		}

		m_shader->makeSafeLods(texSizes, IVec2(viewportWidth, viewportHeight));
	}

	// Render using GLES3.
	{
		sglr::GLContext context(renderCtx, log, sglr::GLCONTEXT_LOG_CALLS|sglr::GLCONTEXT_LOG_PROGRAMS, tcu::IVec4(viewportX, viewportY, viewportWidth, viewportHeight));

		render(context);

		context.readPixels(gles3Frame, 0, 0, viewportWidth, viewportHeight);
	}

	// Render reference image.
	{
		sglr::ReferenceContextBuffers	buffers	(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), 0 /* depth */, 0 /* stencil */, viewportWidth, viewportHeight);
		sglr::ReferenceContext			context	(sglr::ReferenceContextLimits(renderCtx), buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());

		render(context);

		context.readPixels(refFrame, 0, 0, viewportWidth, viewportHeight);
	}

	// Compare images.
	const float		threshold	= 0.001f;
	bool			isOk		= tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refFrame, gles3Frame, threshold, tcu::COMPARE_LOG_RESULT);

	// Store test result.
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");

	return STOP;
}